

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_switch_handler(ion_dictionary_type_t type,ion_dictionary_handler_t *handler)

{
  ion_dictionary_handler_t *handler_local;
  ion_dictionary_type_t type_local;
  
  switch(type) {
  case dictionary_type_bpp_tree_t:
    bpptree_init(handler);
    break;
  case dictionary_type_flat_file_t:
    ffdict_init(handler);
    break;
  case dictionary_type_open_address_file_hash_t:
    oafdict_init(handler);
    break;
  case dictionary_type_open_address_hash_t:
    oadict_init(handler);
    break;
  case dictionary_type_skip_list_t:
    sldict_init(handler);
    break;
  case dictionary_type_linear_hash_t:
    linear_hash_dict_init(handler);
    break;
  case dictionary_type_error_t:
    return '\x12';
  }
  return '\0';
}

Assistant:

ion_err_t
ion_switch_handler(
	ion_dictionary_type_t		type,
	ion_dictionary_handler_t	*handler
) {
	switch (type) {
		case dictionary_type_bpp_tree_t: {
			bpptree_init(handler);
			break;
		}

		case dictionary_type_flat_file_t: {
			ffdict_init(handler);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			oafdict_init(handler);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			oadict_init(handler);
			break;
		}

		case dictionary_type_skip_list_t: {
			sldict_init(handler);
			break;
		}

		case dictionary_type_linear_hash_t: {
			linear_hash_dict_init(handler);
			break;
		}

		case dictionary_type_error_t: {
			return err_uninitialized;
		}
	}

	return err_ok;
}